

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNumber.cpp
# Opt level: O1

Var Js::JavascriptNumber::EntryToFixed(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  int iVar5;
  undefined4 *puVar6;
  Var pvVar7;
  Var pvVar8;
  RecyclableObject *pRVar9;
  JavascriptString *pJVar10;
  uint formatDigits;
  Type TVar11;
  double dVar12;
  int in_stack_00000010;
  CallInfo local_78;
  undefined1 *puStack_70;
  Var local_68;
  double value;
  Var result;
  undefined8 uStack_50;
  CallInfo local_48;
  CallInfo callInfo_local;
  ArgumentReader args;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_48 = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != local_48._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                                ,0x26b,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00ceb0e7;
    *puVar6 = 0;
  }
  callInfo_local = local_48;
  ArgumentReader::AdjustArguments((ArgumentReader *)&callInfo_local,&local_48);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)local_48 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                                ,0x26e,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) goto LAB_00ceb0e7;
    *puVar6 = 0;
  }
  if (((ulong)callInfo_local & 0xffffff) == 0) {
LAB_00ceb0e9:
    JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec3c,L"Number.prototype.toFixed");
  }
  formatDigits = 0;
  pvVar7 = Arguments::operator[]((Arguments *)&callInfo_local,0);
  BVar4 = GetThisValue(pvVar7,(double *)&local_68);
  if (BVar4 == 0) {
    pvVar7 = Arguments::operator[]((Arguments *)&callInfo_local,0);
    if (pvVar7 == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00ceb0e7;
      *puVar6 = 0;
    }
    if (((ulong)pvVar7 & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)pvVar7 & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar3) goto LAB_00ceb0e7;
      *puVar6 = 0;
    }
    TVar11 = TypeIds_FirstNumberType;
    if ((((ulong)pvVar7 & 0xffff000000000000) != 0x1000000000000) &&
       (TVar11 = TypeIds_Number, (ulong)pvVar7 >> 0x32 == 0)) {
      pRVar9 = UnsafeVarTo<Js::RecyclableObject>(pvVar7);
      if (pRVar9 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar3) goto LAB_00ceb0e7;
        *puVar6 = 0;
      }
      TVar11 = ((pRVar9->type).ptr)->typeId;
      if ((0x57 < (int)TVar11) && (BVar4 = RecyclableObject::IsExternal(pRVar9), BVar4 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar3) goto LAB_00ceb0e7;
        *puVar6 = 0;
      }
    }
    if (TVar11 == TypeIds_HostDispatch) {
      pvVar7 = Arguments::operator[]((Arguments *)&callInfo_local,0);
      pRVar9 = VarTo<Js::RecyclableObject>(pvVar7);
      local_78 = callInfo_local;
      puStack_70 = &stack0x00000018;
      iVar5 = (*(pRVar9->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x55])(pRVar9,EntryToFixed,&local_78,&value);
      if (iVar5 != 0) {
        return (Var)value;
      }
    }
    goto LAB_00ceb0e9;
  }
  if (((ulong)callInfo_local & 0xfffffe) == 0) goto LAB_00ceb07d;
  pvVar8 = Arguments::operator[]((Arguments *)&callInfo_local,1);
  pvVar7 = pvVar8;
  if (((ulong)pvVar8 & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)pvVar8 & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    result = pvVar8;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar3) goto LAB_00ceb0e7;
    *puVar6 = 0;
    pvVar7 = result;
  }
  if (((ulong)pvVar8 & 0xffff000000000000) == 0x1000000000000) {
    if (((ulong)pvVar8 & 0x1ffff00000000) != 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar3) {
LAB_00ceb0e7:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
    }
    formatDigits = (uint)pvVar7;
    goto LAB_00ceb07d;
  }
  formatDigits = 0;
  if (pvVar7 == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_00ceb0e7;
    *puVar6 = 0;
  }
  if ((ulong)pvVar7 >> 0x32 == 0) {
    pRVar9 = UnsafeVarTo<Js::RecyclableObject>(pvVar7);
    if (pRVar9 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00ceb0e7;
      *puVar6 = 0;
    }
    TVar11 = ((pRVar9->type).ptr)->typeId;
    if (0x57 < (int)TVar11) {
      BVar4 = RecyclableObject::IsExternal(pRVar9);
      if (BVar4 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar3) goto LAB_00ceb0e7;
        *puVar6 = 0;
      }
      goto LAB_00ceb064;
    }
  }
  else {
LAB_00ceb064:
    TVar11 = TypeIds_Number;
  }
  if (TVar11 != TypeIds_Undefined) {
    dVar12 = JavascriptConversion::ToInteger_Full(pvVar7,pSVar1);
    formatDigits = (uint)dVar12;
  }
LAB_00ceb07d:
  if (formatDigits < 0x15) {
    result = local_68;
    uStack_50 = 0;
    bVar3 = NumberUtilities::IsNan((double)local_68);
    if (bVar3) {
      pJVar10 = StringCache::GetNaNDisplay
                          (&((pSVar1->super_ScriptContextBase).javascriptLibrary)->stringCache);
    }
    else if (1e+21 <= ABS((double)result)) {
      pJVar10 = ToStringRadix10((double)result,pSVar1);
    }
    else {
      pJVar10 = (JavascriptString *)
                FormatDoubleToString((double)result,FormatFixed,formatDigits,pSVar1);
    }
    return pJVar10;
  }
  JavascriptError::ThrowRangeError(pSVar1,-0x7ff5ec5e,(PCWSTR)0x0);
}

Assistant:

Var JavascriptNumber::EntryToFixed(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count == 0)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedNumber, _u("Number.prototype.toFixed"));
        }
        AssertMsg(args.Info.Count > 0, "negative arg count");

        // spec implies ToFixed is not generic. 'this' must be a number
        double value;
        if (!GetThisValue(args[0], &value))
        {
            if (JavascriptOperators::GetTypeId(args[0]) == TypeIds_HostDispatch)
            {
                Var result;
                if (VarTo<RecyclableObject>(args[0])->InvokeBuiltInOperationRemotely(EntryToFixed, args, &result))
                {
                    return result;
                }
            }

            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedNumber, _u("Number.prototype.toFixed"));
        }
        int fractionDigits = 0;
        bool isFractionDigitsInfinite = false;
        if(args.Info.Count > 1)
        {
            //use the first arg as the fraction digits, ignore the rest.
            Var aFractionDigits = args[1];

            // shortcut for tagged int's
            if(TaggedInt::Is(aFractionDigits))
            {
                fractionDigits = TaggedInt::ToInt32(aFractionDigits);
            }
            else if(JavascriptOperators::GetTypeId(aFractionDigits) == TypeIds_Undefined)
            {
                // fraction digits = 0
            }
            else
            {
                double fractionDigitsRaw = JavascriptConversion::ToInteger(aFractionDigits, scriptContext);
                isFractionDigitsInfinite =
                    fractionDigitsRaw == JavascriptNumber::NEGATIVE_INFINITY ||
                    fractionDigitsRaw == JavascriptNumber::POSITIVE_INFINITY;
                fractionDigits = (int)fractionDigitsRaw;
            }
        }

        if (fractionDigits < 0 || fractionDigits > 20)
        {
            JavascriptError::ThrowRangeError(scriptContext, JSERR_FractionOutOfRange);
        }

        if(IsNan(value))
        {
            return ToStringNan(scriptContext);
        }
        if(value >= 1e21 || value <= -1e21)
        {
            return ToStringRadix10(value, scriptContext);
        }

        return FormatDoubleToString(value, NumberUtilities::FormatFixed, fractionDigits, scriptContext);

    }